

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueOptions::MergeFrom(EnumValueOptions *this,EnumValueOptions *from)

{
  bool bVar1;
  EnumValueOptions *in_RSI;
  EnumValueOptions *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff28;
  InternalMetadataWithArena *in_stack_ffffffffffffff30;
  InternalMetadataWithArena *this_00;
  ExtensionSet *in_stack_ffffffffffffff78;
  ExtensionSet *in_stack_ffffffffffffff80;
  
  internal::ExtensionSet::MergeFrom(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff30 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff30 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_ffffffffffffff28);
  bVar1 = _internal_has_deprecated(in_RSI);
  if (bVar1) {
    bVar1 = _internal_deprecated(in_RSI);
    _internal_set_deprecated(in_RDI,bVar1);
  }
  return;
}

Assistant:

void EnumValueOptions::MergeFrom(const EnumValueOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._internal_has_deprecated()) {
    _internal_set_deprecated(from._internal_deprecated());
  }
}